

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

string * __thiscall
ast::Binary_expression::get_symbol_abi_cxx11_
          (string *__return_storage_ptr__,Binary_expression *this)

{
  Value_type VVar1;
  Expression *pEVar2;
  
  if (this->operation - 0x117U < 2) {
    pEVar2 = this->expression_left;
    VVar1 = this->expression_right->type;
    if (pEVar2->type == LABEL && VVar1 == ABSOLUTE) {
      (*pEVar2->_vptr_Expression[4])(__return_storage_ptr__,pEVar2);
      return __return_storage_ptr__;
    }
    if (pEVar2->type == ABSOLUTE && VVar1 == LABEL) {
      (*this->expression_right->_vptr_Expression[4])(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string Binary_expression::get_symbol()
{
	switch (operation) {
	case PLUS:
	case MINUS: {
		Value_type left_type = expression_left->get_type();
		Value_type right_type = expression_right->get_type();
		return left_type == LABEL && right_type == ABSOLUTE
				? expression_left->get_symbol()
				: left_type == ABSOLUTE && right_type == LABEL
					? expression_right->get_symbol()
					: string();
	}
	case SHIFT_LEFT:
	case SHIFT_RIGHT:
	case ASTERISK:
	case SLASH:
	case PERCENT:
	case AMPERSAND_AMPERSAND:
	case PIPE_PIPE:
	case PIPE:
	case AMPERSAND:
	case LESSER:
	case GREATER:
	case LESSER_EQUAL:
	case GREATER_EQUAL:
	case EQUAL_EQUAL:
	case NOT_EQUAL:
	case CIRCUMFLEX:
	default:
		return {};
	}
}